

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void container_suite::test_array_end(void)

{
  char input [2];
  decoder_type decoder;
  value_type local_162 [2];
  undefined4 local_160;
  value local_15c;
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_162 + 1;
  local_162[0] = ']';
  local_162[1] = '\0';
  local_158.input.head = local_162;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_15c = local_158.current.code;
  local_160 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x984,"void container_suite::test_array_end()",&local_15c,&local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[2]>
            ("decoder.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x985,"void container_suite::test_array_end()",&local_158.current.view,"]");
  if (error_unexpected_token < local_158.current.code) {
    if (local_158.current.code == end) {
      local_158.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
    }
  }
  local_160 = 0;
  local_15c = local_158.current.code;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x987,"void container_suite::test_array_end()",&local_15c,&local_160);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}